

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O3

void benchmark_rmu_uncontended(testing t)

{
  int iVar1;
  nsync_mu mu;
  nsync_mu local_20;
  
  iVar1 = testing_n(t);
  nsync::nsync_mu_init(&local_20);
  if (iVar1 != 0) {
    do {
      nsync::nsync_mu_rlock(&local_20);
      nsync::nsync_mu_runlock(&local_20);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

static void benchmark_rmu_uncontended (testing t) {
	int i;
	int n = testing_n (t);
	nsync_mu mu;
	nsync_mu_init (&mu);
	for (i = 0; i != n; i++) {
		nsync_mu_rlock (&mu);
		nsync_mu_runlock (&mu);
	}
}